

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

int delwind(int f,int n)

{
  mgwin *__ptr;
  char cVar1;
  int iVar2;
  mgwin *local_28;
  mgwin *nwp;
  mgwin *wp;
  int n_local;
  int f_local;
  
  __ptr = curwp;
  iVar2 = shrinkwind(8,curwp->w_ntrows + 1);
  if (iVar2 == 0) {
    n_local = 0;
  }
  else {
    cVar1 = __ptr->w_bufp->b_nwnd + -1;
    __ptr->w_bufp->b_nwnd = cVar1;
    if (cVar1 == '\0') {
      __ptr->w_bufp->b_dotp = __ptr->w_dotp;
      __ptr->w_bufp->b_doto = __ptr->w_doto;
      __ptr->w_bufp->b_markp = __ptr->w_markp;
      __ptr->w_bufp->b_marko = __ptr->w_marko;
      __ptr->w_bufp->b_dotline = __ptr->w_dotline;
      __ptr->w_bufp->b_markline = __ptr->w_markline;
    }
    if (__ptr == wheadp) {
      curwp = (__ptr->w_list).l_p.l_wp;
      wheadp = curwp;
    }
    else {
      curwp = (__ptr->w_list).l_p.l_wp;
      if (curwp == (mgwin *)0x0) {
        curwp = wheadp;
      }
    }
    curbp = curwp->w_bufp;
    for (local_28 = wheadp; local_28 != (mgwin *)0x0; local_28 = (local_28->w_list).l_p.l_wp) {
      if ((local_28->w_list).l_p.l_wp == __ptr) {
        (local_28->w_list).l_p = (__ptr->w_list).l_p;
        break;
      }
    }
    free(__ptr);
    n_local = 1;
  }
  return n_local;
}

Assistant:

int
delwind(int f, int n)
{
	struct mgwin	*wp, *nwp;

	wp = curwp;		/* Cheap...		 */

	/* shrinkwind returning false means only one window... */
	if (shrinkwind(FFRAND, wp->w_ntrows + 1) == FALSE)
		return (FALSE);
	if (--wp->w_bufp->b_nwnd == 0) {
		wp->w_bufp->b_dotp = wp->w_dotp;
		wp->w_bufp->b_doto = wp->w_doto;
		wp->w_bufp->b_markp = wp->w_markp;
		wp->w_bufp->b_marko = wp->w_marko;
		wp->w_bufp->b_dotline = wp->w_dotline;
		wp->w_bufp->b_markline = wp->w_markline;
	}

	/* since shrinkwind did't crap out, we know we have a second window */
	if (wp == wheadp)
		wheadp = curwp = wp->w_wndp;
	else if ((curwp = wp->w_wndp) == NULL)
		curwp = wheadp;
	curbp = curwp->w_bufp;
	for (nwp = wheadp; nwp != NULL; nwp = nwp->w_wndp)
		if (nwp->w_wndp == wp) {
			nwp->w_wndp = wp->w_wndp;
			break;
		}
	free(wp);
	return (TRUE);
}